

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mem.c
# Opt level: O0

int main(int argc,char **args)

{
  int iVar1;
  uint uVar2;
  long in_RSI;
  int in_EDI;
  uint32_t **sec;
  int status;
  _light_pcapng_mem *pcapng1;
  light_pcapng pcapng0;
  size_t size;
  uint8_t *data;
  char *file;
  int i;
  undefined4 in_stack_00000054;
  char *in_stack_00000058;
  size_t in_stack_ffffffffffffffa8;
  uint32_t **in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  _light_pcapng_mem *in_stack_ffffffffffffffc0;
  uint32_t *p1;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  for (iVar3 = 1; iVar3 < in_EDI; iVar3 = iVar3 + 1) {
    p1 = *(uint32_t **)(in_RSI + (long)iVar3 * 8);
    iVar1 = read_file(in_stack_00000058,(uint8_t **)CONCAT44(in_stack_00000054,argc),(size_t *)args)
    ;
    if (iVar1 == 0) {
      light_read_from_memory((uint32_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffc0 =
           light_no_copy_from_memory
                     ((uint32_t *)in_stack_ffffffffffffffc0,
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
      uVar2 = light_pcapng_validate((light_pcapng)CONCAT44(iVar3,in_stack_ffffffffffffffe8),p1);
      in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffc0->mem_blocks;
      in_stack_ffffffffffffffbc =
           light_pcapng_validate((light_pcapng)CONCAT44(iVar3,in_stack_ffffffffffffffe8),p1);
      in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & uVar2;
      printf("Internal structure comparison returned %d\n",(ulong)in_stack_ffffffffffffffbc);
      light_pcapng_release((light_pcapng)in_stack_ffffffffffffffc0);
      light_pcapng_mem_release((_light_pcapng_mem *)0x1013dc);
    }
    else {
      fprintf(_stderr,"Unable to read pcapng: %s\n",p1);
    }
  }
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		uint8_t *data;
		size_t size;
		if (read_file(file, &data, &size) == 0) {
			light_pcapng pcapng0 = light_read_from_memory((uint32_t *)data, size);
			struct _light_pcapng_mem *pcapng1 = light_no_copy_from_memory((uint32_t *)data, size, 1);
			int status = light_pcapng_validate(pcapng0, *(uint32_t **)pcapng1);
			uint32_t **sec = (uint32_t **)(((uint32_t **)pcapng1)[1]);

			status &= light_pcapng_validate(pcapng0, sec[0]);

			printf("Internal structure comparison returned %d\n", status);

			light_pcapng_release(pcapng0);
			light_pcapng_mem_release(pcapng1);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	return 0;
}